

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

bool __thiscall QMdiAreaPrivate::lastWindowAboutToBeDestroyed(QMdiAreaPrivate *this)

{
  QPointer<QMdiSubWindow> *pQVar1;
  Data *pDVar2;
  bool bVar3;
  QWidget *this_00;
  
  if ((this->childWindows).d.size == 1) {
    pQVar1 = (this->childWindows).d.ptr;
    pDVar2 = (pQVar1->wp).d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      this_00 = (QWidget *)0x0;
    }
    else {
      this_00 = (QWidget *)(pQVar1->wp).value;
    }
    if (this_00 == (QWidget *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = QWidget::testAttribute_helper(this_00,WA_DeleteOnClose);
      if (bVar3) {
        bVar3 = (bool)((*(byte *)(*(long *)&this_00->field_0x8 + 0x1c1) & 2) >> 1);
      }
      else {
        bVar3 = false;
      }
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool QMdiAreaPrivate::lastWindowAboutToBeDestroyed() const
{
    if (childWindows.size() != 1)
        return false;

    QMdiSubWindow *last = childWindows.at(0);
    if (!last)
        return true;

    if (!last->testAttribute(Qt::WA_DeleteOnClose))
        return false;

    return last->d_func()->data.is_closing;
}